

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PClassPointer::IsMatch(PClassPointer *this,intptr_t id1,intptr_t id2)

{
  bool bVar1;
  
  bVar1 = DObject::IsKindOf((DObject *)id1,PClass::RegistrationInfo.MyClass);
  if (bVar1) {
    return this->ClassRestriction == (PClass *)id2;
  }
  __assert_fail("pointat->IsKindOf(RUNTIME_CLASS(PClass))",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0x79e,"virtual bool PClassPointer::IsMatch(intptr_t, intptr_t) const");
}

Assistant:

bool PClassPointer::IsMatch(intptr_t id1, intptr_t id2) const
{
	const PType *pointat = (const PType *)id1;
	const PClass *classat = (const PClass *)id2;

	assert(pointat->IsKindOf(RUNTIME_CLASS(PClass)));
	return classat == ClassRestriction;
}